

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_inject_to_loop(lws_context_per_thread *pt,lws *wsi)

{
  int iVar1;
  int local_1c;
  int ret;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  local_1c = 1;
  if (((pt->context->event_loop_ops->sock_accept == (_func_int_lws_ptr *)0x0) ||
      (iVar1 = (*pt->context->event_loop_ops->sock_accept)(wsi), iVar1 == 0)) &&
     (iVar1 = __insert_wsi_socket_into_fds(pt->context,wsi), iVar1 == 0)) {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int
lws_wsi_inject_to_loop(struct lws_context_per_thread *pt, struct lws *wsi)
{
	int ret = 1;

	lws_pt_lock(pt, __func__); /* -------------- pt { */

	if (pt->context->event_loop_ops->sock_accept)
		if (pt->context->event_loop_ops->sock_accept(wsi))
			goto bail;

	if (__insert_wsi_socket_into_fds(pt->context, wsi))
		goto bail;

	ret = 0;

bail:
	lws_pt_unlock(pt);

	return ret;
}